

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

config * Configlist_addbasis(rule *rp,int dot)

{
  config *data;
  char *__s;
  size_t nByte;
  config model;
  config local_78;
  
  if (basisend == (config **)0x0) {
    __assert_fail("basisend!=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwenn[P]lemon-rs/third_party/lemon/lemon.c"
                  ,0x5a6,"struct config *Configlist_addbasis(struct rule *, int)");
  }
  if (currentend != (config **)0x0) {
    local_78.rp = rp;
    local_78.dot = dot;
    data = Configtable_find(&local_78);
    if (data == (config *)0x0) {
      data = (config *)lemon_malloc(0x48);
      data->rp = (rule *)0x0;
      *(undefined8 *)&data->dot = 0;
      data->fws = (char *)0x0;
      data->fplp = (plink *)0x0;
      data->bplp = (plink *)0x0;
      data->stp = (state *)0x0;
      *(undefined8 *)&data->status = 0;
      data->next = (config *)0x0;
      data->bp = (config *)0x0;
      data->rp = rp;
      data->dot = dot;
      nByte = (size_t)size;
      __s = (char *)lemon_malloc(nByte);
      memset(__s,0,nByte);
      data->fws = __s;
      data->fplp = (plink *)0x0;
      data->bplp = (plink *)0x0;
      data->stp = (state *)0x0;
      data->next = (config *)0x0;
      data->bp = (config *)0x0;
      *currentend = data;
      currentend = &data->next;
      *basisend = data;
      basisend = &data->bp;
      Configtable_insert(data);
    }
    return data;
  }
  __assert_fail("currentend!=0",
                "/workspace/llm4binary/github/license_c_cmakelists/gwenn[P]lemon-rs/third_party/lemon/lemon.c"
                ,0x5a7,"struct config *Configlist_addbasis(struct rule *, int)");
}

Assistant:

struct config *Configlist_addbasis(struct rule *rp, int dot)
{
  struct config *cfp, model;

  assert( basisend!=0 );
  assert( currentend!=0 );
  model.rp = rp;
  model.dot = dot;
  cfp = Configtable_find(&model);
  if( cfp==0 ){
    cfp = newconfig();
    cfp->rp = rp;
    cfp->dot = dot;
    cfp->fws = SetNew();
    cfp->stp = 0;
    cfp->fplp = cfp->bplp = 0;
    cfp->next = 0;
    cfp->bp = 0;
    *currentend = cfp;
    currentend = &cfp->next;
    *basisend = cfp;
    basisend = &cfp->bp;
    Configtable_insert(cfp);
  }
  return cfp;
}